

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringprintf.cc
# Opt level: O2

string * google::protobuf::StringPrintfVector
                   (string *__return_storage_ptr__,char *format,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *v)

{
  ulong uVar1;
  LogMessage *pLVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined1 local_138 [8];
  char *cstr [32];
  LogFinisher local_29;
  
  puVar3 = *(undefined8 **)v;
  uVar1 = *(long *)(v + 8) - (long)puVar3;
  if (0x400 < uVar1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_138,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/stringprintf.cc"
               ,0x8f);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)local_138,
                        "CHECK failed: (v.size()) <= (kStringPrintfVectorMaxArgs): ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"StringPrintfVector currently only supports up to ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,0x20);
    pLVar2 = internal::LogMessage::operator<<(pLVar2," arguments. ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"Feel free to add support for more if you need it.");
    internal::LogFinisher::operator=(&local_29,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)local_138);
    puVar3 = *(undefined8 **)v;
    uVar1 = *(long *)(v + 8) - (long)puVar3;
  }
  for (uVar4 = 0; (long)uVar1 >> 5 != uVar4; uVar4 = uVar4 + 1) {
    cstr[uVar4 - 1] = (char *)*puVar3;
    puVar3 = puVar3 + 4;
  }
  for (uVar1 = (long)uVar1 >> 5 & 0xffffffff; uVar1 < 0x20; uVar1 = uVar1 + 1) {
    cstr[uVar1 - 1] = string_printf_empty_block;
  }
  StringPrintf_abi_cxx11_
            (__return_storage_ptr__,format,local_138,cstr[0],cstr[1],cstr[2],cstr[3]._0_4_,
             cstr[4]._0_4_,cstr[5]._0_4_,cstr[6]._0_4_,cstr[7]._0_4_,cstr[8]._0_4_,cstr[9]._0_4_,
             cstr[10]._0_4_,cstr[0xb]._0_4_,cstr[0xc]._0_4_,cstr[0xd]._0_4_,cstr[0xe]._0_4_,
             cstr[0xf]._0_4_,cstr[0x10]._0_4_,cstr[0x11]._0_4_,cstr[0x12]._0_4_,cstr[0x13],
             cstr[0x14],cstr[0x15],cstr[0x16],cstr[0x17],cstr[0x18],cstr[0x19],cstr[0x1a],cstr[0x1b]
             ,cstr[0x1c],cstr[0x1d],cstr[0x1e]);
  return __return_storage_ptr__;
}

Assistant:

string StringPrintfVector(const char* format, const std::vector<string>& v) {
  GOOGLE_CHECK_LE(v.size(), kStringPrintfVectorMaxArgs)
      << "StringPrintfVector currently only supports up to "
      << kStringPrintfVectorMaxArgs << " arguments. "
      << "Feel free to add support for more if you need it.";

  // Add filler arguments so that bogus format+args have a harder time
  // crashing the program, corrupting the program (%n),
  // or displaying random chunks of memory to users.

  const char* cstr[kStringPrintfVectorMaxArgs];
  for (int i = 0; i < v.size(); ++i) {
    cstr[i] = v[i].c_str();
  }
  for (int i = v.size(); i < GOOGLE_ARRAYSIZE(cstr); ++i) {
    cstr[i] = &string_printf_empty_block[0];
  }

  // I do not know any way to pass kStringPrintfVectorMaxArgs arguments,
  // or any way to build a va_list by hand, or any API for printf
  // that accepts an array of arguments.  The best I can do is stick
  // this COMPILE_ASSERT right next to the actual statement.

  GOOGLE_COMPILE_ASSERT(kStringPrintfVectorMaxArgs == 32, arg_count_mismatch);
  return StringPrintf(format,
                      cstr[0], cstr[1], cstr[2], cstr[3], cstr[4],
                      cstr[5], cstr[6], cstr[7], cstr[8], cstr[9],
                      cstr[10], cstr[11], cstr[12], cstr[13], cstr[14],
                      cstr[15], cstr[16], cstr[17], cstr[18], cstr[19],
                      cstr[20], cstr[21], cstr[22], cstr[23], cstr[24],
                      cstr[25], cstr[26], cstr[27], cstr[28], cstr[29],
                      cstr[30], cstr[31]);
}